

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O0

void __thiscall Noise::addNoise(Noise *this)

{
  ParameterSet *pPVar1;
  bool bVar2;
  int iVar4;
  size_t sVar5;
  bool bVar3;
  reference pvVar6;
  reference pvVar7;
  Point *pPVar8;
  Normal *pNVar9;
  BaseHandle *pBVar10;
  reference pvVar11;
  reference pvVar12;
  size_type sVar13;
  reference pvVar14;
  Scalar SVar15;
  double StandardDerivation;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  EdgeIter EVar18;
  VertexIter VVar19;
  VertexIter VVar20;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
  GVar21;
  VertexIter VVar22;
  vector_type local_750;
  BaseHandle local_734;
  undefined1 local_730 [8];
  Point p_3;
  VertexHandle vh_1;
  int index_2;
  int i_1;
  vector_type local_700;
  BaseHandle local_6e4;
  undefined1 local_6e0 [8];
  Point p_2;
  VertexHandle vh;
  int index_1;
  int i;
  vector_type local_6a0;
  BaseHandle local_684;
  undefined1 local_680 [8];
  Point p_1;
  undefined1 auStack_660 [4];
  int index;
  value_handle local_658;
  uint uStack_654;
  undefined1 local_650 [8];
  VertexIter v_it_1;
  vector_type local_628;
  BaseHandle local_60c;
  undefined1 local_608 [8];
  Point p;
  undefined1 local_5e0 [8];
  VertexIter v_it;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  VertexListAndGaussianNumbers;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  RandomDirections;
  vector<double,_std::allocator<double>_> GaussianNumbers;
  int impulsive_vertex_number;
  double standard_derivation;
  double edge_numbers;
  EdgeIter local_558;
  undefined1 local_548 [8];
  EdgeIter e_it;
  TriMesh mesh;
  double average_length;
  NoiseDirection noise_direction;
  NoiseType noise_type;
  allocator local_2d1;
  string local_2d0 [36];
  int local_2ac;
  int local_2a8;
  int noise_direction_index;
  int noise_type_index;
  allocator local_279;
  string local_278 [32];
  double local_258;
  double impulsive_level;
  double noise_level;
  TriMesh_ArrayKernelT<MyTraits> local_238;
  Noise *local_10;
  Noise *this_local;
  
  local_10 = this;
  DataManager::getMesh((TriMesh *)&local_238,this->data_manager_);
  sVar5 = OpenMesh::ArrayKernel::n_vertices((ArrayKernel *)&local_238);
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::~TriMesh_ArrayKernelT(&local_238);
  if (sVar5 != 0) {
    pPVar1 = this->parameter_set_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_278,"Noise level",&local_279);
    bVar2 = ParameterSet::getValue(pPVar1,(string *)local_278,&impulsive_level);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      pPVar1 = this->parameter_set_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&noise_type_index,"Impulsive level",
                 (allocator *)((long)&noise_direction_index + 3));
      bVar2 = ParameterSet::getValue(pPVar1,(string *)&noise_type_index,&local_258);
      std::__cxx11::string::~string((string *)&noise_type_index);
      std::allocator<char>::~allocator((allocator<char> *)((long)&noise_direction_index + 3));
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        pPVar1 = this->parameter_set_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d0,"Noise type",&local_2d1);
        bVar2 = ParameterSet::getValue(pPVar1,(string *)local_2d0,&local_2a8);
        std::__cxx11::string::~string(local_2d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          pPVar1 = this->parameter_set_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&noise_type,"Noise direction",
                     (allocator *)((long)&noise_direction + 3));
          bVar2 = ParameterSet::getValue(pPVar1,(string *)&noise_type,&local_2ac);
          std::__cxx11::string::~string((string *)&noise_type);
          std::allocator<char>::~allocator((allocator<char> *)((long)&noise_direction + 3));
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            DataManager::MeshToOriginalMesh(this->data_manager_);
            bVar2 = local_2ac != 0;
            mesh.super_Mesh.
            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            .
            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
            .refcount_fcolors_ = 0;
            mesh.super_Mesh.
            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            .
            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
            .refcount_ftextureIndex_ = 0;
            DataManager::getMesh((TriMesh *)&e_it.hnd_,this->data_manager_);
            EVar18 = OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)&e_it.hnd_);
            while( true ) {
              e_it.mesh_ = EVar18._8_8_;
              local_548 = (undefined1  [8])EVar18.mesh_;
              EVar18 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)&e_it.hnd_);
              local_558 = EVar18;
              bVar3 = OpenMesh::Iterators::
                      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                      ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                                    *)local_548,&local_558);
              if (!bVar3) break;
              pvVar6 = OpenMesh::Iterators::
                       GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                       ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                                    *)local_548);
              SVar15 = OpenMesh::
                       PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                       ::calc_edge_length((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                           *)&e_it.hnd_,(EdgeHandle)(pvVar6->super_BaseHandle).idx_)
              ;
              mesh.super_Mesh.
              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              .
              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
              ._544_8_ = SVar15 + (double)mesh.super_Mesh.
                                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                          .
                                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                          ._544_8_;
              OpenMesh::Iterators::
              GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
              ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                            *)local_548,0);
              EVar18._8_8_ = e_it.mesh_;
              EVar18.mesh_ = (mesh_ptr)local_548;
            }
            sVar5 = OpenMesh::ArrayKernel::n_edges((ArrayKernel *)&e_it.hnd_);
            auVar16._8_4_ = (int)(sVar5 >> 0x20);
            auVar16._0_8_ = sVar5;
            auVar16._12_4_ = 0x45300000;
            StandardDerivation =
                 ((double)mesh.super_Mesh.
                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          .
                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                          ._544_8_ /
                 ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0))) * impulsive_level;
            sVar5 = OpenMesh::ArrayKernel::n_vertices((ArrayKernel *)&e_it.hnd_);
            auVar17._8_4_ = (int)(sVar5 >> 0x20);
            auVar17._0_8_ = sVar5;
            auVar17._12_4_ = 0x45300000;
            iVar4 = (int)(((auVar17._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) *
                         local_258);
            OpenMesh::
            AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
            request_face_normals
                      ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        *)&e_it.hnd_);
            OpenMesh::
            AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
            request_vertex_normals
                      ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        *)&e_it.hnd_);
            OpenMesh::
            PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            ::update_normals((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              *)&e_it.hnd_);
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)
                       &RandomDirections.
                        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
            vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    *)&VertexListAndGaussianNumbers.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &v_it.hnd_);
            if (local_2a8 != 0) {
              if (local_2a8 != 0) {
                sVar5 = OpenMesh::ArrayKernel::n_vertices((ArrayKernel *)&e_it.hnd_);
                randomImpulsiveNumbers
                          (this,0,(int)sVar5 + -1,iVar4,0.0,StandardDerivation,
                           (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            *)&v_it.hnd_);
                if (bVar2) {
                  if (bVar2) {
                    randomDirections(this,iVar4,
                                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      *)&VertexListAndGaussianNumbers.
                                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    vh_1.super_BaseHandle.idx_ = (BaseHandle)0;
                    while( true ) {
                      sVar13 = std::
                               vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ::size((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                       *)&v_it.hnd_);
                      if ((int)sVar13 <= (int)vh_1.super_BaseHandle.idx_) break;
                      pvVar14 = std::
                                vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ::operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                              *)&v_it.hnd_,(long)(int)vh_1.super_BaseHandle.idx_);
                      local_734.idx_ =
                           (int)OpenMesh::ArrayKernel::vertex_handle
                                          ((ArrayKernel *)&e_it.hnd_,pvVar14->first);
                      p_3.super_VectorDataT<double,_3>.values_[2]._4_4_ = local_734.idx_;
                      pPVar8 = OpenMesh::
                               AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                        *)&e_it.hnd_,(VertexHandle)local_734.idx_);
                      pvVar12 = std::
                                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                              *)&VertexListAndGaussianNumbers.
                                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                             (long)(int)vh_1.super_BaseHandle.idx_);
                      pvVar14 = std::
                                vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ::operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                              *)&v_it.hnd_,(long)(int)vh_1.super_BaseHandle.idx_);
                      OpenMesh::VectorT<double,_3>::operator*(&local_750,pvVar12,&pvVar14->second);
                      OpenMesh::VectorT<double,_3>::operator+
                                ((vector_type *)local_730,pPVar8,&local_750);
                      OpenMesh::
                      AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      ::set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                   *)&e_it.hnd_,
                                  (VertexHandle)p_3.super_VectorDataT<double,_3>.values_[2]._4_4_,
                                  (Point *)local_730);
                      vh_1.super_BaseHandle.idx_ = (BaseHandle)((int)vh_1.super_BaseHandle.idx_ + 1)
                      ;
                    }
                  }
                }
                else {
                  vh.super_BaseHandle.idx_ = (BaseHandle)0;
                  while( true ) {
                    sVar13 = std::
                             vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ::size((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                     *)&v_it.hnd_);
                    if ((int)sVar13 <= (int)vh.super_BaseHandle.idx_) break;
                    pvVar14 = std::
                              vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              ::operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                            *)&v_it.hnd_,(long)(int)vh.super_BaseHandle.idx_);
                    local_6e4.idx_ =
                         (int)OpenMesh::ArrayKernel::vertex_handle
                                        ((ArrayKernel *)&e_it.hnd_,pvVar14->first);
                    p_2.super_VectorDataT<double,_3>.values_[2]._4_4_ = local_6e4.idx_;
                    pPVar8 = OpenMesh::
                             AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                      *)&e_it.hnd_,(VertexHandle)local_6e4.idx_);
                    pNVar9 = OpenMesh::
                             AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             ::normal((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       *)&e_it.hnd_,
                                      (VertexHandle)
                                      p_2.super_VectorDataT<double,_3>.values_[2]._4_4_);
                    pvVar14 = std::
                              vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              ::operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                            *)&v_it.hnd_,(long)(int)vh.super_BaseHandle.idx_);
                    OpenMesh::VectorT<double,_3>::operator*(&local_700,pNVar9,&pvVar14->second);
                    OpenMesh::VectorT<double,_3>::operator+
                              ((vector_type *)local_6e0,pPVar8,&local_700);
                    OpenMesh::
                    AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    ::set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                 *)&e_it.hnd_,
                                (VertexHandle)p_2.super_VectorDataT<double,_3>.values_[2]._4_4_,
                                (Point *)local_6e0);
                    vh.super_BaseHandle.idx_ = (BaseHandle)((int)vh.super_BaseHandle.idx_ + 1);
                  }
                }
              }
              VVar20.hnd_.super_BaseHandle.idx_ = local_658.super_BaseHandle.idx_;
              VVar20.skip_bits_ = uStack_654;
              VVar20.mesh_ = _auStack_660;
            }
            else {
              sVar5 = OpenMesh::ArrayKernel::n_vertices((ArrayKernel *)&e_it.hnd_);
              randomGaussianNumbers
                        (this,0.0,StandardDerivation,(int)sVar5,
                         (vector<double,_std::allocator<double>_> *)
                         &RandomDirections.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              VVar20.hnd_.super_BaseHandle.idx_ = local_658.super_BaseHandle.idx_;
              VVar20.skip_bits_ = uStack_654;
              VVar20.mesh_ = _auStack_660;
              if (bVar2) {
                if (bVar2) {
                  sVar5 = OpenMesh::ArrayKernel::n_vertices((ArrayKernel *)&e_it.hnd_);
                  randomDirections(this,(int)sVar5,
                                   (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    *)&VertexListAndGaussianNumbers.
                                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  VVar22 = OpenMesh::PolyConnectivity::vertices_begin
                                     ((PolyConnectivity *)&e_it.hnd_);
                  while( true ) {
                    v_it_1.mesh_ = VVar22._8_8_;
                    local_650 = (undefined1  [8])VVar22.mesh_;
                    VVar20 = OpenMesh::PolyConnectivity::vertices_end
                                       ((PolyConnectivity *)&e_it.hnd_);
                    _auStack_660 = VVar20;
                    bVar2 = OpenMesh::Iterators::
                            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                          *)local_650,
                                         (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                          *)auStack_660);
                    VVar20 = _auStack_660;
                    if (!bVar2) break;
                    pBVar10 = &OpenMesh::Iterators::
                               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                               ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                             *)local_650)->super_BaseHandle;
                    p_1.super_VectorDataT<double,_3>.values_[2]._4_4_ =
                         OpenMesh::BaseHandle::idx(pBVar10);
                    pvVar7 = OpenMesh::Iterators::
                             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                             ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                          *)local_650);
                    local_684.idx_ = (pvVar7->super_BaseHandle).idx_;
                    pPVar8 = OpenMesh::
                             AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                      *)&e_it.hnd_,(VertexHandle)local_684.idx_);
                    pvVar12 = std::
                              vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                            *)&VertexListAndGaussianNumbers.
                                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                           (long)p_1.super_VectorDataT<double,_3>.values_[2]._4_4_);
                    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                        ((vector<double,_std::allocator<double>_> *)
                                         &RandomDirections.
                                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (long)p_1.super_VectorDataT<double,_3>.values_[2]._4_4_);
                    OpenMesh::VectorT<double,_3>::operator*(&local_6a0,pvVar12,pvVar11);
                    OpenMesh::VectorT<double,_3>::operator+
                              ((vector_type *)local_680,pPVar8,&local_6a0);
                    pvVar7 = OpenMesh::Iterators::
                             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                             ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                          *)local_650);
                    OpenMesh::
                    AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    ::set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                 *)&e_it.hnd_,(VertexHandle)(pvVar7->super_BaseHandle).idx_,
                                (Point *)local_680);
                    OpenMesh::Iterators::
                    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                  *)local_650,0);
                    VVar22._8_8_ = v_it_1.mesh_;
                    VVar22.mesh_ = (mesh_ptr)local_650;
                  }
                }
              }
              else {
                VVar19 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)&e_it.hnd_);
                while( true ) {
                  v_it.mesh_ = VVar19._8_8_;
                  local_5e0 = (undefined1  [8])VVar19.mesh_;
                  VVar20 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)&e_it.hnd_);
                  p.super_VectorDataT<double,_3>.values_[2] = (double)VVar20.mesh_;
                  bVar2 = OpenMesh::Iterators::
                          GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                          ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                        *)local_5e0,
                                       (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                        *)(p.super_VectorDataT<double,_3>.values_ + 2));
                  VVar20.hnd_.super_BaseHandle.idx_ = local_658.super_BaseHandle.idx_;
                  VVar20.skip_bits_ = uStack_654;
                  VVar20.mesh_ = _auStack_660;
                  if (!bVar2) break;
                  pvVar7 = OpenMesh::Iterators::
                           GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                           ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                        *)local_5e0);
                  local_60c.idx_ = (pvVar7->super_BaseHandle).idx_;
                  pPVar8 = OpenMesh::
                           AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    *)&e_it.hnd_,(VertexHandle)local_60c.idx_);
                  pvVar7 = OpenMesh::Iterators::
                           GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                           ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                        *)local_5e0);
                  pNVar9 = OpenMesh::
                           AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ::normal((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                     *)&e_it.hnd_,(VertexHandle)(pvVar7->super_BaseHandle).idx_);
                  pBVar10 = &OpenMesh::Iterators::
                             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                             ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                           *)local_5e0)->super_BaseHandle;
                  iVar4 = OpenMesh::BaseHandle::idx(pBVar10);
                  pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                      ((vector<double,_std::allocator<double>_> *)
                                       &RandomDirections.
                                        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (long)iVar4);
                  OpenMesh::VectorT<double,_3>::operator*(&local_628,pNVar9,pvVar11);
                  OpenMesh::VectorT<double,_3>::operator+
                            ((vector_type *)local_608,pPVar8,&local_628);
                  pvVar7 = OpenMesh::Iterators::
                           GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                           ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                        *)local_5e0);
                  OpenMesh::
                  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  ::set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               *)&e_it.hnd_,(VertexHandle)(pvVar7->super_BaseHandle).idx_,
                              (Point *)local_608);
                  GVar21 = OpenMesh::Iterators::
                           GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                           ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                         *)local_5e0,0);
                  VVar19._8_8_ = v_it.mesh_;
                  VVar19.mesh_ = (mesh_ptr)local_5e0;
                  v_it_1._8_8_ = GVar21.mesh_;
                }
              }
            }
            _auStack_660 = VVar20;
            DataManager::setMesh(this->data_manager_,(TriMesh *)&e_it.hnd_);
            DataManager::setNoisyMesh(this->data_manager_,(TriMesh *)&e_it.hnd_);
            DataManager::setDenoisedMesh(this->data_manager_,(TriMesh *)&e_it.hnd_);
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &v_it.hnd_);
            std::
            vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
            ~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                     *)&VertexListAndGaussianNumbers.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)
                       &RandomDirections.
                        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            OpenMesh::TriMesh_ArrayKernelT<MyTraits>::~TriMesh_ArrayKernelT
                      ((TriMesh_ArrayKernelT<MyTraits> *)&e_it.hnd_);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Noise::addNoise()
{
    if(data_manager_->getMesh().n_vertices() == 0)
        return;

    // get parameters
    double noise_level, impulsive_level;
    if(!parameter_set_->getValue(string("Noise level"), noise_level))
        return;
    if(!parameter_set_->getValue(string("Impulsive level"), impulsive_level))
        return;

    int noise_type_index, noise_direction_index;
    if(!parameter_set_->getValue(string("Noise type"), noise_type_index))
        return;
    if(!parameter_set_->getValue(string("Noise direction"), noise_direction_index))
        return;

    data_manager_->MeshToOriginalMesh();

    NoiseType noise_type = (noise_type_index == 0)? kGaussian : kImpulsive;
    NoiseDirection noise_direction = (noise_direction_index == 0)? kNormal : kRandom;

    // compute average length of mesh
    double average_length = 0.0;
    TriMesh mesh = data_manager_->getMesh();
    for(TriMesh::EdgeIter e_it = mesh.edges_begin(); e_it != mesh.edges_end(); e_it++)
        average_length += mesh.calc_edge_length(*e_it);
    double edge_numbers = (double)mesh.n_edges();
    average_length /= edge_numbers;

    // add noise
    double standard_derivation = average_length * noise_level;
    int impulsive_vertex_number = (int)(mesh.n_vertices() * impulsive_level);

    mesh.request_face_normals();
    mesh.request_vertex_normals();
    mesh.update_normals();

    std::vector<double> GaussianNumbers;
    std::vector<TriMesh::Normal> RandomDirections;
    std::vector<std::pair<int, double> > VertexListAndGaussianNumbers;

    if(noise_type == kGaussian){
        randomGaussianNumbers(0, standard_derivation, (int)mesh.n_vertices(), GaussianNumbers);
        if(noise_direction == kNormal){
            for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++){

                TriMesh::Point p = mesh.point(*v_it) + mesh.normal(*v_it) * GaussianNumbers[v_it->idx()];
                mesh.set_point(*v_it, p);
            }
        }
        else if(noise_direction == kRandom){
            randomDirections((int)mesh.n_vertices(), RandomDirections);
            for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++){
                int index = v_it->idx();
                TriMesh::Point p = mesh.point(*v_it) + RandomDirections[index] * GaussianNumbers[index];
                mesh.set_point(*v_it, p);
            }
        }
    }
    else if(noise_type == kImpulsive){
        randomImpulsiveNumbers(0,(int)mesh.n_vertices() - 1, impulsive_vertex_number, 0, standard_derivation, VertexListAndGaussianNumbers);
        if(noise_direction == kNormal){
            for(int i = 0; i < (int)VertexListAndGaussianNumbers.size(); i++){
                int index = VertexListAndGaussianNumbers[i].first;
                TriMesh::VertexHandle vh = mesh.vertex_handle(index);
                TriMesh::Point p =  mesh.point(vh) + mesh.normal(vh) * VertexListAndGaussianNumbers[i].second;
                mesh.set_point(vh, p);
            }
        }
        else if(noise_direction == kRandom){
            randomDirections(impulsive_vertex_number, RandomDirections);
            for(int i = 0; i < (int)VertexListAndGaussianNumbers.size(); i++){
                int index = VertexListAndGaussianNumbers[i].first;
                TriMesh::VertexHandle vh = mesh.vertex_handle(index);
                TriMesh::Point p =  mesh.point(vh) + RandomDirections[i] * VertexListAndGaussianNumbers[i].second;
                mesh.set_point(vh, p);
            }
        }
    }

    data_manager_->setMesh(mesh);
    data_manager_->setNoisyMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}